

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

SharedPtr deqp::gles31::Functional::anon_unknown_0::generateRandomVariableDefinition
                    (Random *rnd,SharedPtr *parentStructure,DataType baseType,Layout *layout,
                    bool allowUnsized)

{
  deInt32 *pdVar1;
  NodeType *pNVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  FormatLayout *pFVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *pSVar10;
  undefined3 in_register_00000081;
  long in_R9;
  int iVar11;
  float fVar12;
  SharedPtr SVar13;
  SharedPtr SVar14;
  SharedPtr currentStructure;
  Node *local_50;
  Node *local_48;
  undefined4 extraout_var_00;
  SharedPtrStateBase *extraout_RDX_01;
  
  iVar4 = CONCAT31(in_register_00000081,allowUnsized);
  local_50 = (Node *)CONCAT44(in_register_00000014,baseType);
  if (layout != (Layout *)0x0) {
    LOCK();
    layout->offset = layout->offset + 1;
    UNLOCK();
    LOCK();
    layout->format = layout->format + FORMATLAYOUT_RGBA16F;
    UNLOCK();
  }
  iVar3 = *(int *)(in_R9 + 4);
  iVar11 = 4;
  local_48 = (Node *)layout;
  do {
    if ((iVar11 != 4 || (char)currentStructure.m_ptr != '\x01') ||
       (fVar12 = deRandom_getFloat((deRandom *)parentStructure), 0.2 <= fVar12)) {
      fVar12 = deRandom_getFloat((deRandom *)parentStructure);
      if (fVar12 < 0.3 && (iVar3 == -1 && (iVar4 != 0x54 && 0xd < iVar4 - 0x45U))) {
        pNVar5 = (Node *)operator_new(0x20);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
        pNVar5->m_type = TYPE_STRUCT_MEMBER;
        (pNVar5->m_enclosingNode).m_ptr = local_50;
        (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)local_48;
        if (local_48 != (Node *)0x0) {
          LOCK();
          local_48->m_type = local_48->m_type + TYPE_SHADER;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
        pNVar6 = (Node *)operator_new(0x20);
      }
      else {
        fVar12 = deRandom_getFloat((deRandom *)parentStructure);
        if (0.3 <= fVar12) break;
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
        pNVar5->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar5->m_enclosingNode).m_ptr = local_50;
        (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)local_48;
        if (local_48 != (Node *)0x0) {
          LOCK();
          local_48->m_type = local_48->m_type + TYPE_SHADER;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
        pNVar6 = (Node *)operator_new(0x20);
      }
    }
    else {
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_50;
      (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)local_48;
      if (local_48 != (Node *)0x0) {
        LOCK();
        local_48->m_type = local_48->m_type + TYPE_SHADER;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
      pNVar6 = (Node *)operator_new(0x20);
    }
    pNVar6->m_type = TYPE_PROGRAM;
    *(FormatLayout *)&pNVar6->field_0xc = FORMATLAYOUT_RGBA32F;
    pNVar6->_vptr_Node = (_func_int **)&PTR__SharedPtrState_00b34b28;
    (pNVar6->m_enclosingNode).m_ptr = pNVar5;
    pNVar6->m_type = TYPE_SHADER;
    *(FormatLayout *)&pNVar6->field_0xc = FORMATLAYOUT_RGBA16F;
    if (local_48 != pNVar6) {
      if (local_48 != (Node *)0x0) {
        LOCK();
        pNVar2 = &local_48->m_type;
        *pNVar2 = *pNVar2 - TYPE_SHADER;
        UNLOCK();
        if (*pNVar2 == TYPE_PROGRAM) {
          (*local_48->_vptr_Node[2])(local_48);
        }
        LOCK();
        pFVar7 = (FormatLayout *)&local_48->field_0xc;
        *pFVar7 = *pFVar7 - FORMATLAYOUT_RGBA16F;
        UNLOCK();
        if ((*pFVar7 == FORMATLAYOUT_RGBA32F) && (local_48 != (Node *)0x0)) {
          (*local_48->_vptr_Node[1])();
        }
      }
      LOCK();
      pNVar6->m_type = pNVar6->m_type + TYPE_SHADER;
      UNLOCK();
      LOCK();
      *(FormatLayout *)&pNVar6->field_0xc =
           *(FormatLayout *)&pNVar6->field_0xc + FORMATLAYOUT_RGBA16F;
      UNLOCK();
      local_50 = pNVar5;
      local_48 = pNVar6;
    }
    pNVar2 = &pNVar6->m_type;
    LOCK();
    *pNVar2 = *pNVar2 - TYPE_SHADER;
    UNLOCK();
    if (*pNVar2 == TYPE_PROGRAM) {
      (*pNVar6->_vptr_Node[2])(pNVar6);
    }
    pFVar7 = (FormatLayout *)&pNVar6->field_0xc;
    LOCK();
    *pFVar7 = *pFVar7 - FORMATLAYOUT_RGBA16F;
    UNLOCK();
    if (*pFVar7 == FORMATLAYOUT_RGBA32F) {
      (*pNVar6->_vptr_Node[1])(pNVar6);
    }
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  puVar8 = (undefined8 *)operator_new(0x28);
  *puVar8 = &PTR__Node_00b34b08;
  *(undefined4 *)(puVar8 + 1) = 3;
  puVar8[2] = local_50;
  puVar8[3] = local_48;
  if (local_48 != (Node *)0x0) {
    LOCK();
    local_48->m_type = local_48->m_type + TYPE_SHADER;
    UNLOCK();
    LOCK();
    *(int *)(puVar8[3] + 0xc) = *(int *)(puVar8[3] + 0xc) + 1;
    UNLOCK();
  }
  *puVar8 = &PTR__Node_00b34c80;
  *(int *)(puVar8 + 4) = iVar4;
  (rnd->m_rnd).z = 0;
  (rnd->m_rnd).w = 0;
  *(undefined8 **)&rnd->m_rnd = puVar8;
  puVar9 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar9 + 1) = 0;
  *(undefined4 *)((long)puVar9 + 0xc) = 0;
  *puVar9 = &PTR__SharedPtrState_00b34b28;
  puVar9[2] = puVar8;
  *(undefined8 **)&(rnd->m_rnd).z = puVar9;
  *(undefined4 *)(puVar9 + 1) = 1;
  *(undefined4 *)((long)puVar9 + 0xc) = 1;
  pNVar5 = local_48;
  pSVar10 = extraout_RDX;
  if (local_48 != (Node *)0x0) {
    LOCK();
    pNVar2 = &local_48->m_type;
    *pNVar2 = *pNVar2 - TYPE_SHADER;
    UNLOCK();
    if (*pNVar2 == TYPE_PROGRAM) {
      iVar4 = (*local_48->_vptr_Node[2])(local_48);
      pNVar5 = (Node *)CONCAT44(extraout_var,iVar4);
      pSVar10 = extraout_RDX_00;
    }
    LOCK();
    pFVar7 = (FormatLayout *)&local_48->field_0xc;
    *pFVar7 = *pFVar7 - FORMATLAYOUT_RGBA16F;
    UNLOCK();
    if ((*pFVar7 == FORMATLAYOUT_RGBA32F) && (local_48 != (Node *)0x0)) {
      SVar13.m_ptr._0_4_ = (*local_48->_vptr_Node[1])();
      SVar13.m_ptr._4_4_ = extraout_var_00;
      SVar13.m_state = extraout_RDX_01;
      return SVar13;
    }
  }
  SVar14.m_state = pSVar10;
  SVar14.m_ptr = pNVar5;
  return SVar14;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomVariableDefinition (de::Random&								rnd,
																			 const ResourceDefinition::Node::SharedPtr&	parentStructure,
																			 glu::DataType								baseType,
																			 const glu::Layout&							layout,
																			 bool										allowUnsized)
{
	const int							maxNesting			= 4;
	ResourceDefinition::Node::SharedPtr	currentStructure	= parentStructure;
	const bool							canBeInsideAStruct	= layout.binding == -1 && !isDataTypeLayoutQualified(baseType);

	for (int nestNdx = 0; nestNdx < maxNesting; ++nestNdx)
	{
		if (allowUnsized && nestNdx == 0 && rnd.getFloat() < 0.2)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		else if (rnd.getFloat() < 0.3 && canBeInsideAStruct)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StructMember(currentStructure));
		else if (rnd.getFloat() < 0.3)
			currentStructure = ResourceDefinition::Node::SharedPtr(new ResourceDefinition::ArrayElement(currentStructure));
		else
			break;
	}

	return ResourceDefinition::Node::SharedPtr(new ResourceDefinition::Variable(currentStructure, baseType));
}